

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkUpdateNameIds(Abc_Ntk_t *p)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  FILE *__stream;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  int Entry;
  ulong uVar10;
  char pFileName [1000];
  char acStack_418 [1000];
  
  if (p->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fb,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  pcVar5 = p->pSpec;
  sVar4 = strlen(pcVar5);
  if (999 < sVar4) {
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fc,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fd,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  pcVar5 = Extra_FileNameGenericAppend(pcVar5,"");
  pcVar6 = Extra_FileNameExtension(p->pSpec);
  sprintf(acStack_418,"%s_%s_names.txt",pcVar5,pcVar6);
  __stream = fopen(acStack_418,"r+");
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  Vec_IntPush(pVVar7,-1);
  iVar3 = fgetc(__stream);
  if (iVar3 != -1) {
    Entry = 1;
    bVar2 = false;
    do {
      if ((iVar3 != 0x20) || (bVar2)) {
        if (iVar3 == 10) {
          bVar2 = false;
        }
      }
      else {
        Vec_IntPush(pVVar7,Entry);
        bVar2 = true;
      }
      iVar3 = fgetc(__stream);
      Entry = Entry + 1;
    } while (iVar3 != -1);
  }
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    uVar10 = 0;
    do {
      if ((((uVar10 != 0) && (pVVar9->pArray[uVar10] != (void *)0x0)) &&
          ((long)uVar10 < (long)p->vNameIds->nSize)) &&
         (uVar1 = p->vNameIds->pArray[uVar10], uVar1 != 0)) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        if (pVVar7->nSize <= (int)(uVar1 >> 1)) {
          __assert_fail("iVar < Vec_IntSize(vStarts)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                        ,0x310,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
        }
        fseek(__stream,(long)pVVar7->pArray[uVar1 >> 1],0);
        pcVar5 = "-";
        if ((uVar1 & 1) == 0) {
          pcVar5 = "";
        }
        fprintf(__stream,"%s%d",pcVar5,uVar10 & 0xffffffff);
        pVVar9 = p->vObjs;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)pVVar9->nSize);
  }
  printf("Saved %d names into file \"%s\".\n",(ulong)(pVVar7->nSize - 1),acStack_418);
  fclose(__stream);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  pVVar7 = p->vNameIds;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vNameIds->pArray = (int *)0x0;
      pVVar7 = p->vNameIds;
      if (pVVar7 == (Vec_Int_t *)0x0) {
        return;
      }
    }
    free(pVVar7);
    p->vNameIds = (Vec_Int_t *)0x0;
  }
  return;
}

Assistant:

void Abc_NtkUpdateNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    Vec_Int_t * vStarts;
    Abc_Obj_t * pObj;
    FILE * pFile;
    int i, c, iVar, fCompl, fSeenSpace, Counter = 0;
    assert( !Abc_NtkIsNetlist(p) );
    assert( strlen(p->pSpec) < 1000 );
    assert( p->vNameIds != NULL );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "r+" );
    // collect info about lines
    fSeenSpace = 0;
    vStarts = Vec_IntAlloc( 1000 );
    Vec_IntPush( vStarts, -1 );
    while ( (c = fgetc(pFile)) != EOF && ++Counter )
        if ( c == ' ' && !fSeenSpace )
            Vec_IntPush(vStarts, Counter), fSeenSpace = 1;
        else if ( c == '\n' )
            fSeenSpace = 0;
    // add info about names
    Abc_NtkForEachObj( p, pObj, i )
    {
        if ( i == 0 || i >= Vec_IntSize(p->vNameIds) || !Vec_IntEntry(p->vNameIds, i) )
            continue;
        iVar = Abc_Lit2Var( Vec_IntEntry(p->vNameIds, i) );
        fCompl = Abc_LitIsCompl( Vec_IntEntry(p->vNameIds, i) );
        assert( iVar < Vec_IntSize(vStarts) );
        fseek( pFile, Vec_IntEntry(vStarts, iVar), SEEK_SET );
        fprintf( pFile, "%s%d", fCompl? "-":"", i );
    }
    printf( "Saved %d names into file \"%s\".\n", Vec_IntSize(vStarts)-1, pFileName );
    fclose( pFile );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vNameIds );
//    Abc_NtkForEachObj( p, pObj, i )
//        Abc_ObjPrint( stdout, pObj );
}